

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

bool transcode_utf8(string *utf8_val,string *result,encoding_e encoding,char unknown)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  QUtil *this;
  undefined7 in_register_00000009;
  _Base_ptr p_Var4;
  unsigned_long uval;
  _Base_ptr p_Var5;
  size_type sVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  bool bVar9;
  bool error;
  size_t pos;
  bool local_61;
  undefined4 local_60;
  int local_5c;
  string local_58;
  size_t local_38;
  
  local_60 = (undefined4)CONCAT71(in_register_00000009,unknown);
  result->_M_string_length = 0;
  *(result->_M_dataplus)._M_p = '\0';
  uVar1 = utf8_val->_M_string_length;
  bVar8 = true;
  bVar9 = true;
  if (encoding == e_pdfdoc) {
    if ((3 < uVar1) && (*(utf8_val->_M_dataplus)._M_p == -0x3d)) {
      if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
           fe_ff_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                       ::fe_ff_abi_cxx11_), iVar3 != 0)) {
        transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
        fe_ff_abi_cxx11_._M_dataplus._M_p =
             (pointer)&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                       ::fe_ff_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::fe_ff_abi_cxx11_,anon_var_dwarf_a46d56,anon_var_dwarf_a46d56 + 3);
        __cxa_atexit(std::__cxx11::string::~string,
                     &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                      ::fe_ff_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                             ::fe_ff_abi_cxx11_);
      }
      if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
           ff_fe_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                       ::ff_fe_abi_cxx11_), iVar3 != 0)) {
        transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
        ff_fe_abi_cxx11_._M_dataplus._M_p =
             (pointer)&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                       ::ff_fe_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::ff_fe_abi_cxx11_,anon_var_dwarf_a47549,anon_var_dwarf_a47549 + 3);
        __cxa_atexit(std::__cxx11::string::~string,
                     &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                      ::ff_fe_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                             ::ff_fe_abi_cxx11_);
      }
      if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
           ef_bb_bf_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                       ::ef_bb_bf_abi_cxx11_), iVar3 != 0)) {
        transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
        ef_bb_bf_abi_cxx11_._M_dataplus._M_p =
             (pointer)&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                       ::ef_bb_bf_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::ef_bb_bf_abi_cxx11_,anon_var_dwarf_a47555,anon_var_dwarf_a47555 + 5);
        __cxa_atexit(std::__cxx11::string::~string,
                     &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                      ::ef_bb_bf_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                             ::ef_bb_bf_abi_cxx11_);
      }
      iVar3 = std::__cxx11::string::compare((ulong)utf8_val,1,(string *)0x3);
      if (((iVar3 == 0) ||
          (iVar3 = std::__cxx11::string::compare((ulong)utf8_val,1,(string *)0x3), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::string::compare((ulong)utf8_val,1,(string *)0x5), iVar3 == 0)) {
        std::__cxx11::string::push_back((char)result);
        bVar8 = false;
        bVar9 = false;
      }
    }
  }
  else if (encoding == e_utf16) {
    std::__cxx11::string::append((char *)result);
  }
  local_38 = 0;
  if (uVar1 != 0) {
    local_5c = (int)(char)local_60;
    do {
      local_61 = false;
      this = (QUtil *)QUtil::get_next_utf8_codepoint(utf8_val,&local_38,&local_61);
      if (local_61 == true) {
        if (encoding != e_utf16) {
LAB_0024718b:
          sVar6 = result->_M_string_length;
          bVar9 = false;
          bVar8 = false;
          goto LAB_00247398;
        }
        std::__cxx11::string::append((char *)result);
        bVar8 = false;
        bVar9 = false;
      }
      else {
        if (this < (QUtil *)0x80) {
          if (encoding == e_pdfdoc) {
            if (this == (QUtil *)0x7f || ((uint)this & 0x78) == 0x18) goto LAB_0024718b;
          }
          else if (encoding == e_utf16) {
            QUtil::toUTF16_abi_cxx11_(&local_58,this,uval);
            std::__cxx11::string::_M_append((char *)result,(ulong)local_58._M_dataplus._M_p);
            goto LAB_00247262;
          }
LAB_002472a1:
          sVar6 = result->_M_string_length;
          goto LAB_00247398;
        }
        if (encoding == e_utf16) {
          QUtil::toUTF16_abi_cxx11_(&local_58,this,uval);
          std::__cxx11::string::_M_append((char *)result,(ulong)local_58._M_dataplus._M_p);
LAB_00247262:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0024739d;
        }
        if (this == (QUtil *)0xad && encoding == e_pdfdoc) goto LAB_0024718b;
        p_Var7 = &unicode_to_mac_roman._M_t._M_impl.super__Rb_tree_header._M_header;
        if (this + -0xa1 < (QUtil *)0x5f) {
          if (encoding != e_pdfdoc) {
            if (encoding == e_macroman) goto LAB_002472eb;
            if (encoding != e_winansi) goto LAB_00247317;
          }
          goto LAB_002472a1;
        }
        if (encoding == e_macroman) {
LAB_002472eb:
          p_Var4 = &unicode_to_mac_roman._M_t._M_impl.super__Rb_tree_header._M_header;
          if (unicode_to_mac_roman._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            p_Var4 = &unicode_to_mac_roman._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var5 = unicode_to_mac_roman._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if (*(QUtil **)(p_Var5 + 1) >= this) {
                p_Var4 = p_Var5;
              }
              p_Var5 = (&p_Var5->_M_left)[*(QUtil **)(p_Var5 + 1) < this];
            } while (p_Var5 != (_Base_ptr)0x0);
          }
LAB_0024734d:
          p_Var5 = p_Var7;
          if ((p_Var4 != p_Var7) && (p_Var5 = p_Var4, this < *(QUtil **)(p_Var4 + 1))) {
            p_Var5 = p_Var7;
          }
          if (p_Var5 == p_Var7) goto LAB_0024736a;
          cVar2 = *(char *)&p_Var5[1]._M_parent;
        }
        else {
          if (encoding == e_winansi) {
            p_Var7 = &unicode_to_win_ansi._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var4 = &unicode_to_win_ansi._M_t._M_impl.super__Rb_tree_header._M_header;
            if (unicode_to_win_ansi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                (_Base_ptr)0x0) {
              p_Var4 = &unicode_to_win_ansi._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var5 = unicode_to_win_ansi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                if (*(QUtil **)(p_Var5 + 1) >= this) {
                  p_Var4 = p_Var5;
                }
                p_Var5 = (&p_Var5->_M_left)[*(QUtil **)(p_Var5 + 1) < this];
              } while (p_Var5 != (_Base_ptr)0x0);
            }
            goto LAB_0024734d;
          }
LAB_00247317:
          if (encoding == e_pdfdoc) {
            p_Var7 = &unicode_to_pdf_doc._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var4 = &unicode_to_pdf_doc._M_t._M_impl.super__Rb_tree_header._M_header;
            if (unicode_to_pdf_doc._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
                (_Base_ptr)0x0) {
              p_Var4 = &unicode_to_pdf_doc._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var5 = unicode_to_pdf_doc._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                if (*(QUtil **)(p_Var5 + 1) >= this) {
                  p_Var4 = p_Var5;
                }
                p_Var5 = (&p_Var5->_M_left)[*(QUtil **)(p_Var5 + 1) < this];
              } while (p_Var5 != (_Base_ptr)0x0);
            }
            goto LAB_0024734d;
          }
LAB_0024736a:
          cVar2 = '\0';
        }
        bVar9 = bVar8;
        if (cVar2 == '\0') {
          bVar9 = false;
        }
        sVar6 = result->_M_string_length;
        bVar8 = bVar9;
LAB_00247398:
        std::__cxx11::string::_M_replace_aux((ulong)result,sVar6,0,'\x01');
      }
LAB_0024739d:
    } while (local_38 < uVar1);
  }
  return bVar9;
}

Assistant:

static bool
transcode_utf8(std::string const& utf8_val, std::string& result, encoding_e encoding, char unknown)
{
    bool okay = true;
    result.clear();
    size_t len = utf8_val.length();
    switch (encoding) {
    case e_utf16:
        result += "\xfe\xff";
        break;
    case e_pdfdoc:
        // We need to avoid having the result start with something that will be interpreted as
        // UTF-16 or UTF-8, meaning we can't end up with a string that starts with "fe ff",
        // (UTF-16-BE) "ff fe" (UTF-16-LE, not officially part of the PDF spec, but recognized by
        // most readers including qpdf), or "ef bb bf" (UTF-8). It's more efficient to check the
        // input string to see if it will map to one of those sequences than to check the output
        // string since all cases start with the same starting character.
        if ((len >= 4) && (utf8_val[0] == '\xc3')) {
            static std::string fe_ff("\xbe\xc3\xbf");
            static std::string ff_fe("\xbf\xc3\xbe");
            static std::string ef_bb_bf("\xaf\xc2\xbb\xc2\xbf");
            // C++-20 has starts_with, but when this was written, qpdf had a minimum supported
            // version of C++-17.
            if ((utf8_val.compare(1, 3, fe_ff) == 0) || (utf8_val.compare(1, 3, ff_fe) == 0) ||
                (utf8_val.compare(1, 5, ef_bb_bf) == 0)) {
                result += unknown;
                okay = false;
            }
        }
        break;
    default:
        break;
    }
    size_t pos = 0;
    while (pos < len) {
        bool error = false;
        unsigned long codepoint = QUtil::get_next_utf8_codepoint(utf8_val, pos, error);
        if (error) {
            okay = false;
            if (encoding == e_utf16) {
                result += "\xff\xfd";
            } else {
                result.append(1, unknown);
            }
        } else if (codepoint < 128) {
            char ch = static_cast<char>(codepoint);
            if (encoding == e_utf16) {
                result += QUtil::toUTF16(QIntC::to_ulong(ch));
            } else if ((encoding == e_pdfdoc) && (((ch >= 0x18) && (ch <= 0x1f)) || (ch == 127))) {
                // PDFDocEncoding maps some low characters to Unicode, so if we encounter those
                // invalid UTF-8 code points, map them to unknown so reversing the mapping doesn't
                // change them into other characters.
                okay = false;
                result.append(1, unknown);
            } else {
                result.append(1, ch);
            }
        } else if (encoding == e_utf16) {
            result += QUtil::toUTF16(codepoint);
        } else if ((codepoint == 0xad) && (encoding == e_pdfdoc)) {
            // PDFDocEncoding omits 0x00ad (soft hyphen).
            okay = false;
            result.append(1, unknown);
        } else if (
            (codepoint > 160) && (codepoint < 256) &&
            ((encoding == e_winansi) || (encoding == e_pdfdoc))) {
            result.append(1, static_cast<char>(codepoint & 0xff));
        } else {
            unsigned char ch = '\0';
            if (encoding == e_winansi) {
                ch = encode_winansi(codepoint);
            } else if (encoding == e_macroman) {
                ch = encode_macroman(codepoint);
            } else if (encoding == e_pdfdoc) {
                ch = encode_pdfdoc(codepoint);
            }
            if (ch == '\0') {
                okay = false;
                ch = static_cast<unsigned char>(unknown);
            }
            result.append(1, static_cast<char>(ch));
        }
    }
    return okay;
}